

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

TimerId __thiscall sznet::net::EventLoop::runAt(EventLoop *this,Timestamp time,TimerCallback *cb)

{
  pointer this_00;
  TimerId TVar1;
  function<void_()> local_50;
  TimerCallback *local_30;
  TimerCallback *cb_local;
  EventLoop *this_local;
  Timestamp time_local;
  
  local_30 = cb;
  cb_local = (TimerCallback *)this;
  this_local = (EventLoop *)time.m_microSecondsSinceEpoch;
  this_00 = std::unique_ptr<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>::operator->
                      (&this->m_timerQueue);
  std::function<void_()>::function(&local_50,cb);
  TVar1 = TimerQueue::addTimer(this_00,&local_50,(Timestamp)this_local,0.0);
  time_local.m_microSecondsSinceEpoch = (int64_t)TVar1.m_timer;
  std::function<void_()>::~function(&local_50);
  TVar1.m_sequence = TVar1.m_sequence;
  TVar1.m_timer = (Timer *)time_local.m_microSecondsSinceEpoch;
  return TVar1;
}

Assistant:

TimerId EventLoop::runAt(Timestamp time, TimerCallback cb)
{
	return m_timerQueue->addTimer(std::move(cb), time, 0.0);
}